

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O2

int reverse_d(int dir)

{
  int iVar1;
  
  iVar1 = 0;
  if ((uint)dir < 6) {
    iVar1 = *(int *)(&DAT_003e9484 + (ulong)(uint)dir * 4);
  }
  return iVar1;
}

Assistant:

int reverse_d(int dir)
{
	int newDir = 0;
	switch(dir)
	{
		case Directions::North:
			newDir = Directions::South;
			break;
		case Directions::South:
			newDir = Directions::North;
			break;
		case Directions::West:
			newDir = Directions::East;
			break;
		case Directions::East:
			newDir = Directions::West;
			break;
		case Directions::Up: 
			newDir = Directions::Down;
			break;
		case Directions::Down:
			newDir = Directions::Up;
			break;
		default:
			newDir = Directions::North;
			break;
	}
	return newDir;
}